

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::PhiInst::useVars(PhiInst *this)

{
  bool bVar1;
  long in_RSI;
  value_type *in_RDI;
  VarId var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range2;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *s;
  VarId *in_stack_ffffffffffffff68;
  VarId *in_stack_ffffffffffffff70;
  value_type *this_00;
  VarId local_40;
  VarId *local_30;
  __normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  memset(in_RDI,0,0x30);
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x1e6a1f);
  local_20 = in_RSI + 0x28;
  local_28._M_current =
       (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                          (in_stack_ffffffffffffff68);
  local_30 = (VarId *)std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                                 in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
    ::operator*(&local_28);
    in_stack_ffffffffffffff70 = &local_40;
    VarId::VarId(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           this_00,in_RDI);
    __gnu_cxx::
    __normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
    ::operator++(&local_28);
  }
  return (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
         in_RDI;
}

Assistant:

std::set<VarId> useVars() const {
    auto s = std::set<VarId>();
    for (auto var : vars) {
      s.insert(var);
    }
    return s;
  }